

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

char * doctest::assertString(Enum at)

{
  if ((int)at < 0x20c) {
    if ((int)at < 0x61) {
      if ((int)at < 0x21) {
        switch(at) {
        case DT_WARN:
          return "WARN";
        case DT_CHECK:
          return "CHECK";
        case DT_REQUIRE:
          return "REQUIRE";
        case DT_WARN_THROWS:
          return "WARN_THROWS";
        case DT_CHECK_THROWS:
          return "CHECK_THROWS";
        case DT_REQUIRE_THROWS:
          return "REQUIRE_THROWS";
        }
      }
      else if ((int)at < 0x41) {
        if (at == DT_WARN_THROWS_AS) {
          return "WARN_THROWS_AS";
        }
        if (at == DT_CHECK_THROWS_AS) {
          return "CHECK_THROWS_AS";
        }
        if (at == DT_REQUIRE_THROWS_AS) {
          return "REQUIRE_THROWS_AS";
        }
      }
      else {
        if (at == DT_WARN_THROWS_WITH) {
          return "WARN_THROWS_WITH";
        }
        if (at == DT_CHECK_THROWS_WITH) {
          return "CHECK_THROWS_WITH";
        }
        if (at == DT_REQUIRE_THROWS_WITH) {
          return "REQUIRE_THROWS_WITH";
        }
      }
    }
    else if ((int)at < 0x84) {
      if ((int)at < 100) {
        if (at == DT_WARN_THROWS_WITH_AS) {
          return "WARN_THROWS_WITH_AS";
        }
        if (at == DT_CHECK_THROWS_WITH_AS) {
          return "CHECK_THROWS_WITH_AS";
        }
      }
      else {
        if (at == DT_REQUIRE_THROWS_WITH_AS) {
          return "REQUIRE_THROWS_WITH_AS";
        }
        if (at == DT_WARN_NOTHROW) {
          return "WARN_NOTHROW";
        }
        if (at == DT_CHECK_NOTHROW) {
          return "CHECK_NOTHROW";
        }
      }
    }
    else if ((int)at < 0x10c) {
      if (at == DT_REQUIRE_NOTHROW) {
        return "REQUIRE_NOTHROW";
      }
      if (at == DT_WARN_FALSE) {
        return "WARN_FALSE";
      }
      if (at == DT_CHECK_FALSE) {
        return "CHECK_FALSE";
      }
    }
    else {
      if (at == DT_REQUIRE_FALSE) {
        return "REQUIRE_FALSE";
      }
      if (at == DT_WARN_UNARY) {
        return "WARN_UNARY";
      }
      if (at == DT_CHECK_UNARY) {
        return "CHECK_UNARY";
      }
    }
  }
  else if ((int)at < 0x100a) {
    if ((int)at < 0x40a) {
      if ((int)at < 0x30a) {
        if (at == DT_REQUIRE_UNARY) {
          return "REQUIRE_UNARY";
        }
        if (at == DT_WARN_UNARY_FALSE) {
          return "WARN_UNARY_FALSE";
        }
      }
      else {
        if (at == DT_CHECK_UNARY_FALSE) {
          return "CHECK_UNARY_FALSE";
        }
        if (at == DT_REQUIRE_UNARY_FALSE) {
          return "REQUIRE_UNARY_FALSE";
        }
        if (at == DT_WARN_EQ) {
          return "WARN_EQ";
        }
      }
    }
    else if ((int)at < 0x80a) {
      if (at == DT_CHECK_EQ) {
        return "CHECK_EQ";
      }
      if (at == DT_REQUIRE_EQ) {
        return "REQUIRE_EQ";
      }
      if (at == DT_WARN_NE) {
        return "WARN_NE";
      }
    }
    else {
      if (at == DT_CHECK_NE) {
        return "CHECK_NE";
      }
      if (at == DT_REQUIRE_NE) {
        return "REQUIRE_NE";
      }
      if (at == DT_WARN_LT) {
        return "WARN_LT";
      }
    }
  }
  else if ((int)at < 0x4009) {
    if ((int)at < 0x2009) {
      if (at == DT_CHECK_LT) {
        return "CHECK_LT";
      }
      if (at == DT_REQUIRE_LT) {
        return "REQUIRE_LT";
      }
    }
    else {
      if (at == DT_WARN_GT) {
        return "WARN_GT";
      }
      if (at == DT_CHECK_GT) {
        return "CHECK_GT";
      }
      if (at == DT_REQUIRE_GT) {
        return "REQUIRE_GT";
      }
    }
  }
  else if ((int)at < 0x8009) {
    if (at == DT_WARN_GE) {
      return "WARN_GE";
    }
    if (at == DT_CHECK_GE) {
      return "CHECK_GE";
    }
    if (at == DT_REQUIRE_GE) {
      return "REQUIRE_GE";
    }
  }
  else {
    if (at == DT_WARN_LE) {
      return "WARN_LE";
    }
    if (at == DT_CHECK_LE) {
      return "CHECK_LE";
    }
    if (at == DT_REQUIRE_LE) {
      return "REQUIRE_LE";
    }
  }
  return "";
}

Assistant:

const char* assertString(assertType::Enum at) {
    DOCTEST_MSVC_SUPPRESS_WARNING_WITH_PUSH(4062) // enum 'x' in switch of enum 'y' is not handled
    switch(at) {  //!OCLINT missing default in switch statements
        case assertType::DT_WARN                    : return "WARN";
        case assertType::DT_CHECK                   : return "CHECK";
        case assertType::DT_REQUIRE                 : return "REQUIRE";

        case assertType::DT_WARN_FALSE              : return "WARN_FALSE";
        case assertType::DT_CHECK_FALSE             : return "CHECK_FALSE";
        case assertType::DT_REQUIRE_FALSE           : return "REQUIRE_FALSE";

        case assertType::DT_WARN_THROWS             : return "WARN_THROWS";
        case assertType::DT_CHECK_THROWS            : return "CHECK_THROWS";
        case assertType::DT_REQUIRE_THROWS          : return "REQUIRE_THROWS";

        case assertType::DT_WARN_THROWS_AS          : return "WARN_THROWS_AS";
        case assertType::DT_CHECK_THROWS_AS         : return "CHECK_THROWS_AS";
        case assertType::DT_REQUIRE_THROWS_AS       : return "REQUIRE_THROWS_AS";

        case assertType::DT_WARN_THROWS_WITH        : return "WARN_THROWS_WITH";
        case assertType::DT_CHECK_THROWS_WITH       : return "CHECK_THROWS_WITH";
        case assertType::DT_REQUIRE_THROWS_WITH     : return "REQUIRE_THROWS_WITH";

        case assertType::DT_WARN_THROWS_WITH_AS     : return "WARN_THROWS_WITH_AS";
        case assertType::DT_CHECK_THROWS_WITH_AS    : return "CHECK_THROWS_WITH_AS";
        case assertType::DT_REQUIRE_THROWS_WITH_AS  : return "REQUIRE_THROWS_WITH_AS";

        case assertType::DT_WARN_NOTHROW            : return "WARN_NOTHROW";
        case assertType::DT_CHECK_NOTHROW           : return "CHECK_NOTHROW";
        case assertType::DT_REQUIRE_NOTHROW         : return "REQUIRE_NOTHROW";

        case assertType::DT_WARN_EQ                 : return "WARN_EQ";
        case assertType::DT_CHECK_EQ                : return "CHECK_EQ";
        case assertType::DT_REQUIRE_EQ              : return "REQUIRE_EQ";
        case assertType::DT_WARN_NE                 : return "WARN_NE";
        case assertType::DT_CHECK_NE                : return "CHECK_NE";
        case assertType::DT_REQUIRE_NE              : return "REQUIRE_NE";
        case assertType::DT_WARN_GT                 : return "WARN_GT";
        case assertType::DT_CHECK_GT                : return "CHECK_GT";
        case assertType::DT_REQUIRE_GT              : return "REQUIRE_GT";
        case assertType::DT_WARN_LT                 : return "WARN_LT";
        case assertType::DT_CHECK_LT                : return "CHECK_LT";
        case assertType::DT_REQUIRE_LT              : return "REQUIRE_LT";
        case assertType::DT_WARN_GE                 : return "WARN_GE";
        case assertType::DT_CHECK_GE                : return "CHECK_GE";
        case assertType::DT_REQUIRE_GE              : return "REQUIRE_GE";
        case assertType::DT_WARN_LE                 : return "WARN_LE";
        case assertType::DT_CHECK_LE                : return "CHECK_LE";
        case assertType::DT_REQUIRE_LE              : return "REQUIRE_LE";

        case assertType::DT_WARN_UNARY              : return "WARN_UNARY";
        case assertType::DT_CHECK_UNARY             : return "CHECK_UNARY";
        case assertType::DT_REQUIRE_UNARY           : return "REQUIRE_UNARY";
        case assertType::DT_WARN_UNARY_FALSE        : return "WARN_UNARY_FALSE";
        case assertType::DT_CHECK_UNARY_FALSE       : return "CHECK_UNARY_FALSE";
        case assertType::DT_REQUIRE_UNARY_FALSE     : return "REQUIRE_UNARY_FALSE";
    }
    DOCTEST_MSVC_SUPPRESS_WARNING_POP
    return "";
}